

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O1

int64_t __thiscall kaitai::kstream::read_s8le(kstream *this)

{
  int64_t t;
  int64_t local_10;
  
  std::istream::read((char *)this->m_io,(long)&local_10);
  return local_10;
}

Assistant:

int64_t kaitai::kstream::read_s8le() {
    int64_t t;
    m_io->read(reinterpret_cast<char *>(&t), 8);
#if __BYTE_ORDER == __BIG_ENDIAN
    t = bswap_64(t);
#endif
    return t;
}